

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O0

void do_springy_proc(Am_Object *param_1)

{
  bool bVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_Object local_50;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object beam;
  Am_Value_List beams;
  bool is_springy;
  Am_Object *param_0_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get(0x3450,(ulong)IS_SPRINGY);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  Am_Object::Set(0x3450,SUB21(IS_SPRINGY,0),(ulong)(~bVar1 & 1U));
  Am_Value_List::Am_Value_List((Am_Value_List *)&beam);
  Am_Object::Am_Object(&local_30);
  pAVar3 = (Am_Value *)Am_Object::Get(0x33f8,0x82);
  Am_Value_List::operator=((Am_Value_List *)&beam,pAVar3);
  Am_Value_List::Start();
  while( true ) {
    bVar2 = Am_Value_List::Last();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    pAVar3 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&local_30,pAVar3);
    if ((~bVar1 & 1U) == 0) {
      Am_Object::Am_Object(&local_50,(Am_Object *)&local_30);
      make_beam_rigid(&local_50);
      Am_Object::~Am_Object(&local_50);
    }
    else {
      Am_Object::Am_Object(local_48,(Am_Object *)&local_30);
      make_beam_springy(local_48);
      Am_Object::~Am_Object(local_48);
    }
    Am_Value_List::Next();
  }
  Am_Object::~Am_Object(&local_30);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&beam);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_springy, (Am_Object))
{
  bool is_springy = SP_Springy_Command.Get(IS_SPRINGY);
  is_springy = !is_springy;
  SP_Springy_Command.Set(IS_SPRINGY, is_springy);

  Am_Value_List beams;
  Am_Object beam;
  beams = SP_Beam_Agg.Get(Am_GRAPHICAL_PARTS);
  for (beams.Start(); !beams.Last(); beams.Next()) {
    beam = beams.Get();
    if (is_springy)
      make_beam_springy(beam);
    else
      make_beam_rigid(beam);
  }
}